

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Type * __thiscall
soul::heart::Parser::parseArrayTypeSuffixes
          (Type *__return_storage_ptr__,Parser *this,Type *elementType)

{
  ArraySize size;
  Category CVar1;
  bool bVar2;
  PrimitiveType PVar3;
  BoundedIntSize BVar4;
  bool bVar5;
  CompileMessage local_90;
  Type local_58;
  Type local_40;
  
  bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2a495b);
  if (bVar5) {
    if ((((elementType->category == invalid) || (elementType->category == array)) ||
        (elementType->isRef != false)) ||
       ((elementType->isConstant != false || ((elementType->primitiveType).type == void_)))) {
      CompileMessageHelpers::createMessage<>
                (&local_90,syntax,error,"Cannot create an array with this element type");
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_90);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_90.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.description._M_dataplus._M_p != &local_90.description.field_2) {
        operator_delete(local_90.description._M_dataplus._M_p,
                        local_90.description.field_2._M_allocated_capacity + 1);
      }
    }
    bVar5 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x27affb);
    if (bVar5) {
      Type::createArray(&local_40,elementType,0);
      parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_40);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
    }
    else {
      size = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).literalIntValue;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x27e4d6);
      if (0x7ffffffe < size - 1) {
        CompileMessageHelpers::createMessage<>(&local_90,syntax,error,"Illegal size");
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_90);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_90.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.description._M_dataplus._M_p != &local_90.description.field_2) {
          operator_delete(local_90.description._M_dataplus._M_p,
                          local_90.description.field_2._M_allocated_capacity + 1);
        }
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x27affb);
      Type::createArray(&local_58,elementType,size);
      parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_58);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
    }
  }
  else {
    CVar1 = elementType->arrayElementCategory;
    bVar5 = elementType->isRef;
    bVar2 = elementType->isConstant;
    PVar3.type = (elementType->primitiveType).type;
    __return_storage_ptr__->category = elementType->category;
    __return_storage_ptr__->arrayElementCategory = CVar1;
    __return_storage_ptr__->isRef = bVar5;
    __return_storage_ptr__->isConstant = bVar2;
    __return_storage_ptr__->primitiveType = (PrimitiveType)PVar3.type;
    BVar4 = elementType->arrayElementBoundingSize;
    __return_storage_ptr__->boundingSize = elementType->boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = BVar4;
    (__return_storage_ptr__->structure).object = (elementType->structure).object;
    (elementType->structure).object = (Structure *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

Type parseArrayTypeSuffixes (Type elementType)
    {
        if (matchIf (HEARTOperator::openBracket))
        {
            if (! elementType.canBeArrayElementType())
                throwError (Errors::wrongTypeForArrayElement());

            if (matchIf (HEARTOperator::closeBracket))
                return parseArrayTypeSuffixes (elementType.createUnsizedArray());

            auto size = parseLiteralInt();

            if (! Type::canBeSafelyCastToArraySize (size))
                throwError (Errors::illegalSize());

            expect (HEARTOperator::closeBracket);
            return parseArrayTypeSuffixes (elementType.createArray (static_cast<Type::ArraySize> (size)));
        }

        return elementType;
    }